

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

Error __thiscall asmjit::String::_opChars(String *this,uint32_t op,char c,size_t n)

{
  char *__s;
  Error EVar1;
  
  EVar1 = 0;
  if (n != 0) {
    __s = prepare(this,op,n);
    if (__s == (char *)0x0) {
      EVar1 = 1;
    }
    else {
      memset(__s,(uint)(byte)c,n);
      EVar1 = 0;
    }
  }
  return EVar1;
}

Assistant:

Error String::_opChars(uint32_t op, char c, size_t n) noexcept {
  if (!n)
    return kErrorOk;

  char* p = prepare(op, n);
  if (!p)
    return DebugUtils::errored(kErrorOutOfMemory);

  memset(p, c, n);
  return kErrorOk;
}